

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronized_timer.cpp
# Opt level: O1

void __thiscall
jessilib::synchonrized_callback::synchonrized_callback
          (synchonrized_callback *this,synchonrized_callback *in_callback)

{
  undefined8 uVar1;
  
  *(undefined8 *)&(this->m_callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_callback).super__Function_base._M_functor + 8) = 0;
  (this->m_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_callback)._M_invoker = (in_callback->m_callback)._M_invoker;
  if ((in_callback->m_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(in_callback->m_callback).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_callback).super__Function_base._M_functor =
         *(undefined8 *)&(in_callback->m_callback).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->m_callback).super__Function_base._M_functor + 8) = uVar1;
    (this->m_callback).super__Function_base._M_manager =
         (in_callback->m_callback).super__Function_base._M_manager;
    (in_callback->m_callback).super__Function_base._M_manager = (_Manager_type)0x0;
    (in_callback->m_callback)._M_invoker = (_Invoker_type)0x0;
  }
  (this->m_calls).super___atomic_base<unsigned_int>._M_i = 0;
  cancel_token::cancel_token(&this->m_cancel_token);
  return;
}

Assistant:

synchonrized_callback(synchonrized_callback&& in_callback)
		: m_callback{ std::move(in_callback.m_callback) } {
		// Empty ctor body
	}